

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::CheckIndices(Discreet3DSImporter *this,Mesh *sMesh)

{
  uint uVar1;
  bool bVar2;
  reference pFVar3;
  size_type sVar4;
  Logger *pLVar5;
  uint local_2c;
  iterator iStack_28;
  uint a;
  __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
  local_20;
  iterator i;
  Mesh *sMesh_local;
  Discreet3DSImporter *this_local;
  
  i._M_current = (Face *)sMesh;
  local_20._M_current =
       (Face *)std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::begin
                         (&(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
  while( true ) {
    iStack_28 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::end
                          ((vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *)
                           (i._M_current[1].super_FaceWithSmoothingGroup.mIndices + 2));
    bVar2 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar2) break;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
               ::operator*(&local_20);
      uVar1 = (pFVar3->super_FaceWithSmoothingGroup).mIndices[local_2c];
      sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         i._M_current);
      if (sVar4 <= uVar1) {
        pLVar5 = DefaultLogger::get();
        Logger::warn(pLVar5,"3DS: Vertex index overflow)");
        sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           i._M_current);
        pFVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                 ::operator*(&local_20);
        (pFVar3->super_FaceWithSmoothingGroup).mIndices[local_2c] = (int)sVar4 - 1;
      }
      bVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (i._M_current[6].super_FaceWithSmoothingGroup.mIndices + 2));
      if (!bVar2) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                 ::operator*(&local_20);
        uVar1 = (pFVar3->super_FaceWithSmoothingGroup).mIndices[local_2c];
        sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (i._M_current[6].super_FaceWithSmoothingGroup.mIndices + 2));
        if (sVar4 <= uVar1) {
          pLVar5 = DefaultLogger::get();
          Logger::warn(pLVar5,"3DS: Texture coordinate index overflow)");
          sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             (i._M_current[6].super_FaceWithSmoothingGroup.mIndices + 2));
          pFVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                   ::operator*(&local_20);
          (pFVar3->super_FaceWithSmoothingGroup).mIndices[local_2c] = (int)sVar4 - 1;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Discreet3DSImporter::CheckIndices(D3DS::Mesh& sMesh)
{
    for (std::vector< D3DS::Face >::iterator i =  sMesh.mFaces.begin(); i != sMesh.mFaces.end();++i)
    {
        // check whether all indices are in range
        for (unsigned int a = 0; a < 3;++a)
        {
            if ((*i).mIndices[a] >= sMesh.mPositions.size())
            {
                ASSIMP_LOG_WARN("3DS: Vertex index overflow)");
                (*i).mIndices[a] = (uint32_t)sMesh.mPositions.size()-1;
            }
            if ( !sMesh.mTexCoords.empty() && (*i).mIndices[a] >= sMesh.mTexCoords.size())
            {
                ASSIMP_LOG_WARN("3DS: Texture coordinate index overflow)");
                (*i).mIndices[a] = (uint32_t)sMesh.mTexCoords.size()-1;
            }
        }
    }
}